

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall Fluid::set_common_uniforms(Fluid *this,Program *program)

{
  PFNGLUNIFORM2IVPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  p_Var2 = glad_glUniform3fv;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"bounds_min","");
  GVar4 = (*glad_glGetUniformLocation)(program->id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"bounds_max","");
  GVar4 = (*glad_glGetUniformLocation)(program->id,(GLchar *)local_70[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var3 = glad_glUniform3iv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"grid_dim","");
  GVar4 = (*glad_glGetUniformLocation)(program->id,(GLchar *)local_90[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var1 = glad_glUniform2iv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"resolution","");
  GVar4 = (*glad_glGetUniformLocation)(program->id,(GLchar *)local_b0[0]);
  (*p_Var1)(GVar4,1,(GLint *)&this->resolution);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void set_common_uniforms(gfx::Program& program) {
        glUniform3fv(program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform2iv(program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
    }